

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

int __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::IdxCompare::operator()(IdxCompare *this,Element *e1,Element *e2)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  undefined4 local_4;
  
  bVar1 = EQ(*(int *)(in_RSI + 0x38),*(int *)(in_RDX + 0x38));
  if (bVar1) {
    local_4 = 0;
  }
  else if (*(int *)(in_RSI + 0x38) < *(int *)(in_RDX + 0x38)) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int operator()(const typename SVectorBase<R>::Element& e1,
                     const typename SVectorBase<R>::Element& e2) const
      {
         if(EQ(e1.idx, e2.idx))
            return 0;

         if(e1.idx < e2.idx)
            return -1;
         else // (e1.idx > e2.idx)
            return 1;
      }